

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Token __thiscall slang::parsing::Preprocessor::nextRaw(Preprocessor *this)

{
  Token *pTVar1;
  Token TVar2;
  int iVar3;
  size_type sVar4;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  BumpAllocator *alloc;
  Token token;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  anon_class_8_1_8991fb9c checkBranchStack;
  Token local_e8;
  anon_class_16_2_db6d24d4 appendTrivia;
  Trivia local_c8;
  SmallVector<slang::parsing::Trivia,_8UL> trivia;
  
  if ((this->currentToken).info == (Info *)0x0) {
    pTVar1 = this->currentMacroToken;
    if (pTVar1 == (Token *)0x0) {
      token = Lexer::lex((Lexer *)(this->lexerStack).
                                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                  .data_[(this->lexerStack).
                                         super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                         .len - 1]._M_t.
                                  super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                  .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>,
                         (this->keywordVersionStack).
                         super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]);
      if (token.kind == EndOfFile) {
        checkBranchStack.this = this;
        local_e8 = token;
        popSource(this);
        if ((this->lexerStack).
            super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
            .len == 0) {
          nextRaw::anon_class_8_1_8991fb9c::operator()(&checkBranchStack);
        }
        else {
          trivia.super_SmallVectorBase<slang::parsing::Trivia>.data_ =
               (pointer)trivia.super_SmallVectorBase<slang::parsing::Trivia>.firstElement;
          trivia.super_SmallVectorBase<slang::parsing::Trivia>.len = 0;
          trivia.super_SmallVectorBase<slang::parsing::Trivia>.cap = 8;
          appendTrivia.trivia = &trivia;
          appendTrivia.this = this;
          nextRaw::anon_class_16_2_db6d24d4::operator()(&appendTrivia,token);
          sVar4 = (this->lexerStack).
                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                  .len;
          do {
            local_e8 = Lexer::lex((Lexer *)(this->lexerStack).
                                           super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                           .data_[sVar4 - 1]._M_t.
                                           super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                           .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>,
                                  (this->keywordVersionStack).
                                  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish[-1]);
            nextRaw::anon_class_16_2_db6d24d4::operator()(&appendTrivia,local_e8);
            src = extraout_RDX;
            if (local_e8.kind != EndOfFile) goto LAB_00582b28;
            popSource(this);
            sVar4 = (this->lexerStack).
                    super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                    .len;
          } while (sVar4 != 0);
          nextRaw::anon_class_8_1_8991fb9c::operator()(&checkBranchStack);
          src = extraout_RDX_00;
LAB_00582b28:
          if ((trivia.super_SmallVectorBase<slang::parsing::Trivia>.len == 0) ||
             (trivia.super_SmallVectorBase<slang::parsing::Trivia>.data_
              [trivia.super_SmallVectorBase<slang::parsing::Trivia>.len - 1].kind != EndOfLine)) {
            Trivia::Trivia(&local_c8,EndOfLine,(string_view)(ZEXT816(0x88e35c) << 0x40));
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,&local_c8);
            src = extraout_RDX_01;
          }
          alloc = this->alloc;
          iVar3 = SmallVectorBase<slang::parsing::Trivia>::copy
                            (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,
                             (EVP_PKEY_CTX *)alloc,src);
          trivia_00._M_ptr._4_4_ = extraout_var;
          trivia_00._M_ptr._0_4_ = iVar3;
          trivia_00._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
          token = Token::withTrivia(&local_e8,alloc,trivia_00);
          SmallVectorBase<slang::parsing::Trivia>::cleanup
                    (&trivia.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)alloc);
        }
      }
    }
    else {
      TVar2 = *pTVar1;
      token = *pTVar1;
      this->currentMacroToken = pTVar1 + 1;
      if (pTVar1 + 1 ==
          (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_ +
          (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len) {
        this->currentMacroToken = (Token *)0x0;
        (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
        token = TVar2;
      }
    }
  }
  else {
    Token::Token((Token *)&trivia);
    token = this->currentToken;
    *(pointer *)&this->currentToken = trivia.super_SmallVectorBase<slang::parsing::Trivia>.data_;
    (this->currentToken).info = (Info *)trivia.super_SmallVectorBase<slang::parsing::Trivia>.len;
  }
  return token;
}

Assistant:

Token Preprocessor::nextRaw() {
    // it's possible we have a token buffered from looking ahead when handling a directive
    if (currentToken)
        return std::exchange(currentToken, Token());

    // if we just expanded a macro we'll have tokens from that to return
    if (currentMacroToken) {
        auto result = *currentMacroToken;
        currentMacroToken++;
        if (currentMacroToken == expandedTokens.end()) {
            currentMacroToken = nullptr;
            expandedTokens.clear();
        }
        return result;
    }

    // if this assert fires, the user disregarded an EoF and kept calling next()
    SLANG_ASSERT(!lexerStack.empty());

    // Pull the next token from the active source.
    // This is the common case.
    auto& source = lexerStack.back();
    auto token = source->lex(keywordVersionStack.back());
    if (token.kind != TokenKind::EndOfFile)
        return token;

    auto checkBranchStack = [&] {
        if (!branchStack.empty())
            addDiag(diag::MissingEndIfDirective, branchStack.back().directive.range());
    };

    // don't return EndOfFile tokens for included files, fall
    // through to loop to merge trivia
    popSource();
    if (lexerStack.empty()) {
        checkBranchStack();
        return token;
    }

    // Rare case: we have an EoF from an include file... we don't want to return
    // that one, but we do want to merge its trivia with whatever comes next.
    SmallVector<Trivia, 8> trivia;
    auto appendTrivia = [&trivia, this](Token token) {
        trivia.append_range(token.trivia());
        SourceLocation loc = token.location();
        if (!token.trivia().empty())
            trivia.back() = trivia.back().withLocation(alloc, loc);
    };

    appendTrivia(token);

    while (true) {
        auto& nextSource = lexerStack.back();
        token = nextSource->lex(keywordVersionStack.back());
        appendTrivia(token);
        if (token.kind != TokenKind::EndOfFile)
            break;

        popSource();
        if (lexerStack.empty()) {
            checkBranchStack();
            break;
        }
    }

    // Ensure EoL at the end of trivia to prevent inlining issues
    if (trivia.empty() || trivia.back().kind != TriviaKind::EndOfLine)
        trivia.push_back(Trivia(TriviaKind::EndOfLine, ""sv));

    // finally found a real token to return, so update trivia and get out of here
    return token.withTrivia(alloc, trivia.copy(alloc));
}